

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O1

void gost_cnt_next(void *ctx,uchar *iv,uchar *buf)

{
  uchar buf1 [8];
  undefined8 local_20;
  
  if ((*(int *)((long)ctx + 8) != 0) && (*(int *)((long)ctx + 4) == 0x400)) {
    cryptopro_key_meshing((gost_ctx *)((long)ctx + 0x1c),iv);
  }
  if (*(int *)((long)ctx + 4) == 0) {
    gostcrypt((gost_ctx *)((long)ctx + 0x1c),iv,(byte *)&local_20);
  }
  else {
    local_20 = *(undefined8 *)iv;
  }
  local_20 = CONCAT44((local_20._4_4_ - (local_20._4_4_ < 0xfefefefc)) + 0x1010105,
                      (int)local_20 + 0x1010101);
  *(undefined8 *)iv = local_20;
  gostcrypt((gost_ctx *)((long)ctx + 0x1c),(byte *)&local_20,buf);
  *(uint *)((long)ctx + 4) = (*(uint *)((long)ctx + 4) & 0x3ff) + 8;
  return;
}

Assistant:

static void gost_cnt_next(void *ctx, unsigned char *iv, unsigned char *buf)
{
    struct ossl_gost_cipher_ctx *c = ctx;
    word32 g, go;
    unsigned char buf1[8];
    assert(c->count % 8 == 0 && c->count <= 1024);
    if (c->key_meshing && c->count == 1024) {
        cryptopro_key_meshing(&(c->cctx), iv);
    }
    if (c->count == 0) {
        gostcrypt(&(c->cctx), iv, buf1);
    } else {
        memcpy(buf1, iv, 8);
    }
    g = buf1[0] | (buf1[1] << 8) | (buf1[2] << 16) | ((word32) buf1[3] << 24);
    g += 0x01010101;
    buf1[0] = (unsigned char)(g & 0xff);
    buf1[1] = (unsigned char)((g >> 8) & 0xff);
    buf1[2] = (unsigned char)((g >> 16) & 0xff);
    buf1[3] = (unsigned char)((g >> 24) & 0xff);
    g = buf1[4] | (buf1[5] << 8) | (buf1[6] << 16) | ((word32) buf1[7] << 24);
    go = g;
    g += 0x01010104;
    if (go > g)                 /* overflow */
        g++;
    buf1[4] = (unsigned char)(g & 0xff);
    buf1[5] = (unsigned char)((g >> 8) & 0xff);
    buf1[6] = (unsigned char)((g >> 16) & 0xff);
    buf1[7] = (unsigned char)((g >> 24) & 0xff);
    memcpy(iv, buf1, 8);
    gostcrypt(&(c->cctx), buf1, buf);
    c->count = c->count % 1024 + 8;
}